

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::visitDrop(Vacuum *this,Drop *curr)

{
  bool bVar1;
  Expression *pEVar2;
  PassOptions *passOptions;
  Module *module;
  Block *expression;
  Expression **ppEVar3;
  size_t sVar4;
  bool local_37a;
  bool local_379;
  byte local_339;
  Type local_330;
  BasicType local_324;
  Type local_320;
  BasicType local_314;
  If *local_310;
  If *iff;
  Block *local_300;
  Expression *temp;
  char *pcStack_2f0;
  undefined1 local_2e0 [8];
  BranchSeeker seeker;
  bool canPop;
  Expression *last;
  Block *block;
  EffectAnalyzer local_188;
  BasicType local_24;
  LocalSet *local_20;
  LocalSet *set;
  Drop *curr_local;
  Vacuum *this_local;
  
  set = (LocalSet *)curr;
  curr_local = (Drop *)this;
  pEVar2 = optimize(this,curr->value,false,false);
  *(Expression **)&set->index = pEVar2;
  if (*(long *)&set->index == 0) {
    ExpressionManipulator::nop<wasm::Drop>((Drop *)set);
  }
  else {
    local_20 = Expression::dynCast<wasm::LocalSet>(*(Expression **)&set->index);
    if (local_20 == (LocalSet *)0x0) {
      local_24 = none;
      bVar1 = wasm::Type::operator==
                        (&(set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                          type,&local_24);
      local_339 = 0;
      if (bVar1) {
        passOptions = Pass::getPassOptions((Pass *)this);
        module = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                           ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           );
        EffectAnalyzer::EffectAnalyzer(&local_188,passOptions,module,(Expression *)set);
        bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_188);
        local_339 = bVar1 ^ 0xff;
        EffectAnalyzer::~EffectAnalyzer(&local_188);
      }
      if ((local_339 & 1) == 0) {
        expression = Expression::dynCast<wasm::Block>(*(Expression **)&set->index);
        if (expression != (Block *)0x0) {
          ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&(expression->list).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          pEVar2 = *ppEVar3;
          bVar1 = wasm::Type::isConcrete(&pEVar2->type);
          if (((bVar1) &&
              (bVar1 = wasm::Type::operator==
                                 (&(expression->super_SpecificExpression<(wasm::Expression::Id)1>).
                                   super_Expression.type,&pEVar2->type), bVar1)) &&
             (pEVar2 = optimize(this,pEVar2,false,false), pEVar2 == (Expression *)0x0)) {
            seeker.types._M_h._M_single_bucket._7_1_ = 1;
            bVar1 = IString::is(&(expression->name).super_IString);
            if (bVar1) {
              temp = (Expression *)(expression->name).super_IString.str._M_len;
              pcStack_2f0 = (expression->name).super_IString.str._M_str;
              BranchUtils::BranchSeeker::BranchSeeker
                        ((BranchSeeker *)local_2e0,(Name)(expression->name).super_IString.str);
              local_300 = expression;
              Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
              ::walk((Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      *)local_2e0,(Expression **)&local_300);
              if (((int)seeker.target.super_IString.str._M_str != 0) &&
                 (bVar1 = wasm::Type::
                          hasLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                                    ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                                      *)&seeker.found), bVar1)) {
                seeker.types._M_h._M_single_bucket._7_1_ = 0;
              }
              BranchUtils::BranchSeeker::~BranchSeeker((BranchSeeker *)local_2e0);
            }
            if ((seeker.types._M_h._M_single_bucket._7_1_ & 1) != 0) {
              ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                  (&(expression->list).
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  );
              *ppEVar3 = (Expression *)0x0;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                        (&(expression->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
              wasm::Type::Type((Type *)&iff,none);
              (expression->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
              id = (uintptr_t)iff;
              sVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                (&(expression->list).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                );
              if (1 < sVar4) {
                ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::
                replaceCurrent(&(this->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                               ,(Expression *)expression);
                return;
              }
              sVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                (&(expression->list).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                );
              if (sVar4 == 1) {
                ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                          operator[](&(expression->list).
                                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                     ,0);
                ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::
                replaceCurrent(&(this->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                               ,*ppEVar3);
                return;
              }
              ExpressionManipulator::nop<wasm::Drop>((Drop *)set);
              return;
            }
          }
        }
        local_310 = Expression::dynCast<wasm::If>(*(Expression **)&set->index);
        if (((local_310 != (If *)0x0) && (local_310->ifFalse != (Expression *)0x0)) &&
           (bVar1 = wasm::Type::isConcrete
                              (&(local_310->super_SpecificExpression<(wasm::Expression::Id)2>).
                                super_Expression.type), bVar1)) {
          local_314 = unreachable;
          bVar1 = wasm::Type::operator==(&local_310->ifTrue->type,&local_314);
          local_379 = false;
          if (bVar1) {
            local_379 = wasm::Type::isConcrete(&local_310->ifFalse->type);
          }
          if (local_379 == false) {
            local_324 = unreachable;
            bVar1 = wasm::Type::operator==(&local_310->ifFalse->type,&local_324);
            local_37a = false;
            if (bVar1) {
              local_37a = wasm::Type::isConcrete(&local_310->ifTrue->type);
            }
            if (local_37a != false) {
              *(Expression **)&set->index = local_310->ifTrue;
              local_310->ifTrue = (Expression *)set;
              wasm::Type::Type(&local_330,none);
              (local_310->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.
              id = local_330.id;
              ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::
              replaceCurrent(&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                             ,(Expression *)local_310);
            }
          }
          else {
            *(Expression **)&set->index = local_310->ifFalse;
            local_310->ifFalse = (Expression *)set;
            wasm::Type::Type(&local_320,none);
            (local_310->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id
                 = local_320.id;
            ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                      (&(this->
                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                        ).
                        super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                       ,(Expression *)local_310);
          }
        }
      }
      else {
        ExpressionManipulator::nop<wasm::Drop>((Drop *)set);
      }
    }
    else {
      bVar1 = LocalSet::isTee(local_20);
      if (!bVar1) {
        __assert_fail("set->isTee()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Vacuum.cpp"
                      ,0x14f,"void wasm::Vacuum::visitDrop(Drop *)");
      }
      LocalSet::makeSet(local_20);
      ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                 (Expression *)local_20);
    }
  }
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    // optimize the dropped value, maybe leaving nothing
    curr->value = optimize(curr->value, false, false);
    if (curr->value == nullptr) {
      ExpressionManipulator::nop(curr);
      return;
    }
    // a drop of a tee is a set
    if (auto* set = curr->value->dynCast<LocalSet>()) {
      assert(set->isTee());
      set->makeSet();
      replaceCurrent(set);
      return;
    }

    // If the value has no side effects, or it has side effects we can remove,
    // do so. This basically means that if noTrapsHappen is set then we can
    // use that assumption (that no trap actually happens at runtime) and remove
    // a trapping value.
    //
    // TODO: A complete CFG analysis for noTrapsHappen mode, removing all code
    //       that definitely reaches a trap, *even if* it has side effects.
    //
    // Note that we check the type here to avoid removing unreachable code - we
    // leave that for DCE.
    if (curr->type == Type::none &&
        !EffectAnalyzer(getPassOptions(), *getModule(), curr)
           .hasUnremovableSideEffects()) {
      ExpressionManipulator::nop(curr);
      return;
    }

    // if we are dropping a block's return value, we might be able to remove it
    // entirely
    if (auto* block = curr->value->dynCast<Block>()) {
      auto* last = block->list.back();
      // note that the last element may be concrete but not the block, if the
      // block has an unreachable element in the middle, making the block
      // unreachable despite later elements and in particular the last
      if (last->type.isConcrete() && block->type == last->type) {
        last = optimize(last, false, false);
        if (!last) {
          // we may be able to remove this, if there are no brs
          bool canPop = true;
          if (block->name.is()) {
            BranchUtils::BranchSeeker seeker(block->name);
            Expression* temp = block;
            seeker.walk(temp);
            if (seeker.found && Type::hasLeastUpperBound(seeker.types)) {
              canPop = false;
            }
          }
          if (canPop) {
            block->list.back() = last;
            block->list.pop_back();
            block->type = Type::none;
            // we don't need the drop anymore, let's see what we have left in
            // the block
            if (block->list.size() > 1) {
              replaceCurrent(block);
            } else if (block->list.size() == 1) {
              replaceCurrent(block->list[0]);
            } else {
              ExpressionManipulator::nop(curr);
            }
            return;
          }
        }
      }
    }
    // sink a drop into an arm of an if-else if the other arm ends in an
    // unreachable, as it if is a branch, this can make that branch optimizable
    // and more vaccuming possible
    auto* iff = curr->value->dynCast<If>();
    if (iff && iff->ifFalse && iff->type.isConcrete()) {
      // reuse the drop in both cases
      if (iff->ifTrue->type == Type::unreachable &&
          iff->ifFalse->type.isConcrete()) {
        curr->value = iff->ifFalse;
        iff->ifFalse = curr;
        iff->type = Type::none;
        replaceCurrent(iff);
      } else if (iff->ifFalse->type == Type::unreachable &&
                 iff->ifTrue->type.isConcrete()) {
        curr->value = iff->ifTrue;
        iff->ifTrue = curr;
        iff->type = Type::none;
        replaceCurrent(iff);
      }
    }
  }